

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall
cmFileAPI::BuildClientReplyResponse
          (Value *__return_storage_ptr__,cmFileAPI *this,ClientRequest *request)

{
  ulong uVar1;
  Value *other;
  Value local_50;
  undefined1 local_21;
  ClientRequest *local_20;
  ClientRequest *request_local;
  cmFileAPI *this_local;
  Value *response;
  
  local_21 = 0;
  local_20 = request;
  request_local = (ClientRequest *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    BuildReplyError(&local_50,&local_20->Error);
    Json::Value::operator=(__return_storage_ptr__,&local_50);
    Json::Value::~Value(&local_50);
  }
  else {
    other = AddReplyIndexObject(this,&local_20->super_Object);
    Json::Value::operator=(__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReplyResponse(ClientRequest const& request)
{
  Json::Value response;
  if (!request.Error.empty()) {
    response = this->BuildReplyError(request.Error);
    return response;
  }
  response = this->AddReplyIndexObject(request);
  return response;
}